

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O1

array<int,_8UL> *
dgrminer::smallerDirectionOfAdjacencyInfo
          (array<int,_8UL> *__return_storage_ptr__,array<int,_8UL> *adjacencyinfo)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  array<int,_8UL> *paVar5;
  array<int,_8UL> flipped;
  
  flipped._M_elems[0] = adjacencyinfo->_M_elems[5];
  flipped._M_elems[1] = adjacencyinfo->_M_elems[6];
  flipped._M_elems[2] = adjacencyinfo->_M_elems[2];
  if (flipped._M_elems[2] == 1) {
    flipped._M_elems[2] = 2;
  }
  else if (flipped._M_elems[2] == 2) {
    flipped._M_elems[2] = 1;
  }
  flipped._M_elems[3] = adjacencyinfo->_M_elems[3];
  flipped._M_elems[4] = adjacencyinfo->_M_elems[4];
  flipped._M_elems[5] = adjacencyinfo->_M_elems[0];
  flipped._M_elems[6] = adjacencyinfo->_M_elems[1];
  flipped._M_elems[7] = adjacencyinfo->_M_elems[7];
  lVar4 = 0;
  do {
    paVar5 = adjacencyinfo;
    if ((adjacencyinfo->_M_elems[lVar4] < flipped._M_elems[lVar4]) ||
       (paVar5 = &flipped, flipped._M_elems[lVar4] < adjacencyinfo->_M_elems[lVar4])) break;
    lVar4 = lVar4 + 1;
    paVar5 = adjacencyinfo;
  } while (lVar4 != 8);
  uVar1 = *(undefined8 *)paVar5->_M_elems;
  uVar2 = *(undefined8 *)(paVar5->_M_elems + 2);
  uVar3 = *(undefined8 *)(paVar5->_M_elems + 6);
  *(undefined8 *)(__return_storage_ptr__->_M_elems + 4) = *(undefined8 *)(paVar5->_M_elems + 4);
  *(undefined8 *)(__return_storage_ptr__->_M_elems + 6) = uVar3;
  *(undefined8 *)__return_storage_ptr__->_M_elems = uVar1;
  *(undefined8 *)(__return_storage_ptr__->_M_elems + 2) = uVar2;
  return __return_storage_ptr__;
}

Assistant:

std::array<int, 8> smallerDirectionOfAdjacencyInfo(std::array<int, 8> &adjacencyinfo)
    {

        std::array<int, 8> flipped = flipAdjacencyInfo(adjacencyinfo);
        for (int i = 0; i < 8; i++)
        {
            if (adjacencyinfo[i] < flipped[i])
            {
                return adjacencyinfo;
            }
            else if (adjacencyinfo[i] > flipped[i])
            {
                return flipped;
            }
        }
        return adjacencyinfo;
    }